

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aesgcmsiv.cc
# Opt level: O0

int anon_unknown.dwarf_208998::aead_aes_gcm_siv_init
              (EVP_AEAD_CTX *ctx,uint8_t *key,size_t key_len,size_t tag_len)

{
  aead_aes_gcm_siv_ctx *gcm_siv_ctx;
  size_t key_bits;
  size_t tag_len_local;
  size_t key_len_local;
  uint8_t *key_local;
  EVP_AEAD_CTX *ctx_local;
  
  if ((key_len << 3 == 0x80) || (key_len << 3 == 0x100)) {
    key_bits = tag_len;
    if (tag_len == 0) {
      key_bits = 0x10;
    }
    if (key_bits == 0x10) {
      ::OPENSSL_memset(&ctx->state,0,0x108);
      aes_ctr_set_key((AES_KEY *)&ctx->state,(int *)0x0,(block128_f *)((long)&ctx->state + 0xf8),key
                      ,key_len);
      (ctx->state).opaque[0x100] = (ctx->state).opaque[0x100] & 0xfe | key_len == 0x20;
      ctx->tag_len = '\x10';
      ctx_local._4_4_ = 1;
    }
    else {
      ERR_put_error(0x1e,0,0x74,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aesgcmsiv.cc"
                    ,0x235);
      ctx_local._4_4_ = 0;
    }
  }
  else {
    ERR_put_error(0x1e,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aesgcmsiv.cc"
                  ,0x22d);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int aead_aes_gcm_siv_init(EVP_AEAD_CTX *ctx, const uint8_t *key, size_t key_len,
                          size_t tag_len) {
  const size_t key_bits = key_len * 8;

  if (key_bits != 128 && key_bits != 256) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BAD_KEY_LENGTH);
    return 0;  // EVP_AEAD_CTX_init should catch this.
  }

  if (tag_len == EVP_AEAD_DEFAULT_TAG_LENGTH) {
    tag_len = EVP_AEAD_AES_GCM_SIV_TAG_LEN;
  }
  if (tag_len != EVP_AEAD_AES_GCM_SIV_TAG_LEN) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_TAG_TOO_LARGE);
    return 0;
  }

  struct aead_aes_gcm_siv_ctx *gcm_siv_ctx =
      (struct aead_aes_gcm_siv_ctx *)&ctx->state;
  OPENSSL_memset(gcm_siv_ctx, 0, sizeof(struct aead_aes_gcm_siv_ctx));

  aes_ctr_set_key(&gcm_siv_ctx->ks.ks, NULL, &gcm_siv_ctx->kgk_block, key,
                  key_len);
  gcm_siv_ctx->is_256 = (key_len == 32);
  ctx->tag_len = tag_len;

  return 1;
}